

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall crnlib::symbol_codec::decode_bits(symbol_codec *this,uint num_bits)

{
  uint uVar1;
  uint uVar2;
  uint b;
  uint a;
  uint num_bits_local;
  symbol_codec *this_local;
  
  if (num_bits == 0) {
    this_local._4_4_ = 0;
  }
  else if (num_bits < 0x11) {
    this_local._4_4_ = get_bits(this,num_bits);
  }
  else {
    uVar1 = get_bits(this,num_bits - 0x10);
    uVar2 = get_bits(this,0x10);
    this_local._4_4_ = uVar1 << 0x10 | uVar2;
  }
  return this_local._4_4_;
}

Assistant:

uint symbol_codec::decode_bits(uint num_bits) {
  CRNLIB_ASSERT(m_mode == cDecoding);

  if (!num_bits)
    return 0;

  if (num_bits > 16) {
    uint a = get_bits(num_bits - 16);
    uint b = get_bits(16);

    return (a << 16) | b;
  } else
    return get_bits(num_bits);
}